

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::GenerateImportTargetsConfig
          (cmExportInstallFileGenerator *this,ostream *os,string *config,string *suffix)

{
  cmExportSet *pcVar1;
  pointer puVar2;
  cmGeneratorTarget *target;
  cmGeneratorTarget *headTarget;
  bool bVar3;
  TargetType TVar4;
  cmLocalGenerator *lg;
  cmExportInstallFileGenerator *this_00;
  pointer puVar5;
  string_view str;
  string importedXcFrameworkLocation;
  ImportPropertyMap properties;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  importedLocations;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = this->IEGen->ExportSet;
  puVar5 = (pcVar1->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pcVar1->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = this;
  while( true ) {
    if (puVar5 == puVar2) break;
    TVar4 = GetExportTargetType(this_00,(puVar5->_M_t).
                                        super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                                        .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl
                               );
    if (TVar4 != INTERFACE_LIBRARY) {
      properties._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      properties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &properties._M_t._M_impl.super__Rb_tree_header._M_header;
      properties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &importedLocations._M_t._M_impl.super__Rb_tree_header._M_header;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      properties._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      SetImportLocationProperty
                (this_00,config,suffix,
                 ((puVar5->_M_t).
                  super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                  super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                  super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->ArchiveGenerator,
                 &properties,&importedLocations);
      SetImportLocationProperty
                (this_00,config,suffix,
                 ((puVar5->_M_t).
                  super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                  super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                  super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->LibraryGenerator,
                 &properties,&importedLocations);
      SetImportLocationProperty
                (this_00,config,suffix,
                 ((puVar5->_M_t).
                  super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                  super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                  super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->RuntimeGenerator,
                 &properties,&importedLocations);
      SetImportLocationProperty
                (this_00,config,suffix,
                 ((puVar5->_M_t).
                  super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                  super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                  super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->ObjectsGenerator,
                 &properties,&importedLocations);
      SetImportLocationProperty
                (this_00,config,suffix,
                 ((puVar5->_M_t).
                  super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                  super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                  super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->FrameworkGenerator,
                 &properties,&importedLocations);
      SetImportLocationProperty
                (this_00,config,suffix,
                 ((puVar5->_M_t).
                  super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                  super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                  super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->BundleGenerator,
                 &properties,&importedLocations);
      if (properties._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        target = ((puVar5->_M_t).
                  super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                  super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                  super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target;
        cmExportFileGenerator::SetImportDetailProperties
                  (&this->super_cmExportFileGenerator,config,suffix,target,&properties);
        cmExportFileGenerator::SetImportLinkInterface
                  (&this->super_cmExportFileGenerator,config,suffix,InstallInterface,target,
                   &properties);
        std::__cxx11::string::string
                  ((string *)&importedXcFrameworkLocation,
                   (string *)
                   &((puVar5->_M_t).
                     super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                     super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->
                    XcFrameworkLocation);
        if (importedXcFrameworkLocation._M_string_length != 0) {
          cmGeneratorExpression::Preprocess
                    (&local_50,&importedXcFrameworkLocation,InstallInterface,true);
          std::__cxx11::string::operator=
                    ((string *)&importedXcFrameworkLocation,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::string((string *)&local_70,(string *)&importedXcFrameworkLocation);
          lg = cmGeneratorTarget::GetLocalGenerator
                         (((puVar5->_M_t).
                           super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                           .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target);
          headTarget = ((puVar5->_M_t).
                        super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                        .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          local_90._M_string_length = 0;
          local_90.field_2._M_local_buf[0] = '\0';
          cmGeneratorExpression::Evaluate
                    (&local_50,&local_70,lg,config,headTarget,(cmGeneratorExpressionDAGChecker *)0x0
                     ,headTarget,&local_90);
          std::__cxx11::string::operator=
                    ((string *)&importedXcFrameworkLocation,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_70);
          if (importedXcFrameworkLocation._M_string_length != 0) {
            bVar3 = cmsys::SystemTools::FileIsFullPath(&importedXcFrameworkLocation);
            if (!bVar3) {
              str._M_str = importedXcFrameworkLocation._M_dataplus._M_p;
              str._M_len = importedXcFrameworkLocation._M_string_length;
              bVar3 = cmHasLiteralPrefix<19ul>(str,(char (*) [19])"${_IMPORT_PREFIX}/");
              if (!bVar3) {
                cmStrCat<char_const(&)[19],std::__cxx11::string&>
                          (&local_50,(char (*) [19])"${_IMPORT_PREFIX}/",
                           &importedXcFrameworkLocation);
                std::__cxx11::string::operator=
                          ((string *)&importedXcFrameworkLocation,(string *)&local_50);
                std::__cxx11::string::~string((string *)&local_50);
              }
            }
          }
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                  (this,os,config,suffix,target,&properties,&importedXcFrameworkLocation);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[8])
                  (this,os,target,&properties,&importedLocations,&importedXcFrameworkLocation);
        std::__cxx11::string::~string((string *)&importedXcFrameworkLocation);
      }
      this_00 = (cmExportInstallFileGenerator *)&properties;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&importedLocations._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this_00);
    }
    puVar5 = puVar5 + 1;
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix)
{
  // Add each target in the set to the export.
  for (std::unique_ptr<cmTargetExport> const& te :
       this->IEGen->GetExportSet()->GetTargetExports()) {
    // Collect import properties for this target.
    if (this->GetExportTargetType(te.get()) ==
        cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    ImportPropertyMap properties;
    std::set<std::string> importedLocations;

    this->SetImportLocationProperty(config, suffix, te->ArchiveGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->LibraryGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->RuntimeGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->ObjectsGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->FrameworkGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->BundleGenerator,
                                    properties, importedLocations);

    // If any file location was set for the target add it to the
    // import file.
    if (!properties.empty()) {
      // Get the rest of the target details.
      cmGeneratorTarget* gtgt = te->Target;
      this->SetImportDetailProperties(config, suffix, gtgt, properties);

      this->SetImportLinkInterface(config, suffix,
                                   cmGeneratorExpression::InstallInterface,
                                   gtgt, properties);

      // TODO: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      std::string importedXcFrameworkLocation = te->XcFrameworkLocation;
      if (!importedXcFrameworkLocation.empty()) {
        importedXcFrameworkLocation = cmGeneratorExpression::Preprocess(
          importedXcFrameworkLocation,
          cmGeneratorExpression::PreprocessContext::InstallInterface, true);
        importedXcFrameworkLocation = cmGeneratorExpression::Evaluate(
          importedXcFrameworkLocation, te->Target->GetLocalGenerator(), config,
          te->Target, nullptr, te->Target);
        if (!importedXcFrameworkLocation.empty() &&
            !cmSystemTools::FileIsFullPath(importedXcFrameworkLocation) &&
            !cmHasLiteralPrefix(importedXcFrameworkLocation,
                                "${_IMPORT_PREFIX}/")) {
          importedXcFrameworkLocation =
            cmStrCat("${_IMPORT_PREFIX}/", importedXcFrameworkLocation);
        }
      }
      this->GenerateImportPropertyCode(os, config, suffix, gtgt, properties,
                                       importedXcFrameworkLocation);
      this->GenerateImportedFileChecksCode(
        os, gtgt, properties, importedLocations, importedXcFrameworkLocation);
    }
  }
}